

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TileLED.cpp
# Opt level: O2

string * __thiscall TileLED::toString_abi_cxx11_(string *__return_storage_ptr__,TileLED *this)

{
  std::__cxx11::string::string
            ((string *)__return_storage_ptr__,
             (string *)
             (OUTPUT_SYMBOL_TABLE_abi_cxx11_.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start +
             (long)*(int *)&(this->super_Tile).field_0x24 + -1));
  return __return_storage_ptr__;
}

Assistant:

string TileLED::toString() const {
    return OUTPUT_SYMBOL_TABLE[_state - 1];
}